

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

void __thiscall M7Getter::~M7Getter(M7Getter *this)

{
  size_type sVar1;
  reference pp_Var2;
  ulong local_18;
  size_t i;
  M7Getter *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::size
                      (&this->algo_count);
    if (sVar1 <= local_18) break;
    pp_Var2 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::operator[]
                        (&this->algo_count,local_18);
    if (*pp_Var2 != (value_type)0x0) {
      pp_Var2 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                operator[](&this->algo_count,local_18);
      if (*pp_Var2 != (value_type)0x0) {
        operator_delete(*pp_Var2);
      }
      pp_Var2 = std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::
                operator[](&this->algo_count,local_18);
      *pp_Var2 = (value_type)0x0;
    }
    local_18 = local_18 + 1;
  }
  std::vector<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::~vector
            (&this->algo_count);
  return;
}

Assistant:

M7Getter::~M7Getter()
{
    for (size_t i = 0; i < algo_count.size(); i++)
    {
        if (algo_count[i] != NULL)
        {
            delete algo_count[i];
            algo_count[i] = NULL;
        }
    }
}